

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grow_one_util.cpp
# Opt level: O0

void __thiscall Structure::mark_start_residue(Structure *this,int start)

{
  Residue *pRVar1;
  int local_24;
  int iAtom;
  Residue *start_res;
  int start_local;
  Structure *this_local;
  
  pRVar1 = this->_res + start;
  Atom::move_to_origin(pRVar1->_atom + 2);
  Atom::move_to_origin(pRVar1->_atom + 3);
  if (pRVar1->_type != 5) {
    Atom::move_to_origin(pRVar1->_atom + 5);
    for (local_24 = 6; local_24 < pRVar1->_numAtom; local_24 = local_24 + 1) {
      Atom::move_to_origin(pRVar1->_atom + local_24);
    }
  }
  return;
}

Assistant:

void Structure::mark_start_residue(const int start) {
    // For start residue, N and CA are known
    Residue& start_res = this->_res[start];
    start_res._atom[ATM_C].move_to_origin();
    start_res._atom[ATM_O].move_to_origin();
    if (start_res._type != GLY) {
        start_res._atom[ATM_CB].move_to_origin();
        for (int iAtom=NUM_BB_ATOM; iAtom < start_res._numAtom; ++iAtom) {
            start_res._atom[iAtom].move_to_origin();
        }
    }
}